

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::tableLanguage(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *this_01;
  uint uVar1;
  int iVar2;
  RefAST RVar3;
  NoViableAltException *pNVar4;
  RefCount<AST> *this_02;
  RefAST tmp40_AST;
  RefAST tmp42_AST;
  RefAST tmp41_AST;
  RefAST tableLanguage_AST;
  ASTPair currentAST;
  RefAST tmp39_AST;
  undefined1 local_c8 [16];
  ASTFactory local_b8;
  ASTPair local_a8;
  RefCount<Token> local_98;
  ASTFactory local_90;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefCount<AST> local_70;
  RefToken local_68;
  RefToken local_60;
  RefAST local_58;
  RefAST local_50;
  RefAST local_48;
  RefAST local_40;
  RefAST local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  local_b8.nodeFactory = (factory_type)nullAST;
  local_a8.root.ref = (Ref *)0x0;
  local_a8.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_b8.nodeFactory = (factory_type)0x0;
  }
  else {
    uVar1 = (nullAST.ref)->count;
    (nullAST.ref)->count = uVar1 + 1;
    ((Ref *)local_b8.nodeFactory)->count = uVar1 + 2;
  }
  local_70.ref = (Ref *)local_b8.nodeFactory;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
  this_01 = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)local_c8,(RefToken *)this_01);
  RefCount<AST>::operator=(&local_70,(RefCount<AST> *)local_c8);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_c8);
  RefCount<Token>::~RefCount(&local_78);
  Parser::match((Parser *)this,6);
  local_c8._0_8_ = nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_c8._0_8_ = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
  ASTFactory::create(&local_b8,(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)local_c8,(RefCount<AST> *)&local_b8);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_b8);
  RefCount<Token>::~RefCount(&local_80);
  if ((Ref *)local_c8._0_8_ == (Ref *)0x0) {
    local_50.ref = (Ref *)0x0;
  }
  else {
    *(uint *)(local_c8._0_8_ + 8) = *(uint *)(local_c8._0_8_ + 8) + 1;
    local_50.ref = (Ref *)local_c8._0_8_;
  }
  ASTFactory::addASTChild(this_01,&local_a8,&local_50);
  RefCount<AST>::~RefCount(&local_50);
  Parser::match((Parser *)this,0x23);
  local_b8._vptr_ASTFactory = (_func_int **)nullAST;
  if (nullAST.ref == (Ref *)0x0) {
    local_b8._vptr_ASTFactory = (_func_int **)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90.nodeFactory,this,1);
  ASTFactory::create((ASTFactory *)(local_c8 + 8),(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)&local_b8,(RefCount<AST> *)(local_c8 + 8));
  RefCount<AST>::~RefCount((RefCount<AST> *)(local_c8 + 8));
  RefCount<Token>::~RefCount((RefCount<Token> *)&local_90.nodeFactory);
  Parser::match((Parser *)this,7);
  uVar1 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (0xf < uVar1) {
LAB_0018bc25:
    pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
    NoViableAltException::NoViableAltException(pNVar4,&local_60);
    __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  if ((0xe300U >> (uVar1 & 0x1f) & 1) == 0) {
    if (uVar1 != 0xb) goto LAB_0018bc25;
    directives(this);
    local_58.ref = this_00->ref;
    if (local_58.ref == (Ref *)0x0) {
      local_58.ref = (Ref *)0x0;
    }
    else {
      (local_58.ref)->count = (local_58.ref)->count + 1;
    }
    ASTFactory::addASTChild(this_01,&local_a8,&local_58);
    RefCount<AST>::~RefCount(&local_58);
  }
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar3 = nullAST;
  if (iVar2 - 0xdU < 3) goto LAB_0018bda6;
  if (iVar2 == 9) goto LAB_0018bda6;
  if (iVar2 != 8) {
    pNVar4 = (NoViableAltException *)__cxa_allocate_exception(0x40);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
    NoViableAltException::NoViableAltException(pNVar4,&local_68);
    __cxa_throw(pNVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  if (nullAST.ref == (Ref *)0x0) {
    RVar3.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  local_c8._8_8_ = RVar3.ref;
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
  ASTFactory::create(&local_90,(RefToken *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)(local_c8 + 8),(RefCount<AST> *)&local_90);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_90);
  RefCount<Token>::~RefCount(&local_98);
  Parser::match((Parser *)this,8);
  this_02 = (RefCount<AST> *)(local_c8 + 8);
  while( true ) {
    while( true ) {
      while( true ) {
        RefCount<AST>::~RefCount(this_02);
LAB_0018bda6:
        iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
        if (iVar2 != 0xe) break;
        tableDecl(this);
        local_48.ref = this_00->ref;
        if (local_48.ref == (Ref *)0x0) {
          local_48.ref = (Ref *)0x0;
        }
        else {
          (local_48.ref)->count = (local_48.ref)->count + 1;
        }
        this_02 = &local_48;
        ASTFactory::addASTChild(this_01,&local_a8,this_02);
      }
      if (iVar2 != 0xd) break;
      languageSpecList(this);
      local_40.ref = this_00->ref;
      if (local_40.ref == (Ref *)0x0) {
        local_40.ref = (Ref *)0x0;
      }
      else {
        (local_40.ref)->count = (local_40.ref)->count + 1;
      }
      this_02 = &local_40;
      ASTFactory::addASTChild(this_01,&local_a8,this_02);
    }
    if (iVar2 != 9) break;
    languageEnv(this);
    local_38.ref = this_00->ref;
    if (local_38.ref == (Ref *)0x0) {
      local_38.ref = (Ref *)0x0;
    }
    else {
      (local_38.ref)->count = (local_38.ref)->count + 1;
    }
    this_02 = &local_38;
    ASTFactory::addASTChild(this_01,&local_a8,this_02);
  }
  RefCount<AST>::operator=((RefCount<AST> *)&local_b8.nodeFactory,&local_a8.root);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_b8);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_c8);
  RefCount<AST>::~RefCount(&local_70);
  RefCount<AST>::operator=(this_00,(RefCount<AST> *)&local_b8.nodeFactory);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_b8.nodeFactory);
  RefCount<AST>::~RefCount(&local_a8.child);
  RefCount<AST>::~RefCount(&local_a8.root);
  return;
}

Assistant:

void GrpParser::tableLanguage() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST tableLanguage_AST = nullAST;
	
	try {      // for error handling
		RefAST tmp39_AST = nullAST;
		tmp39_AST = astFactory.create(LT(1));
		match(OP_LPAREN);
		RefAST tmp40_AST = nullAST;
		tmp40_AST = astFactory.create(LT(1));
		astFactory.addASTChild(currentAST, tmp40_AST);
		match(LITERAL_language);
		RefAST tmp41_AST = nullAST;
		tmp41_AST = astFactory.create(LT(1));
		match(OP_RPAREN);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			directives();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_SEMI:
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp42_AST = nullAST;
			tmp42_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case LITERAL_environment:
		case IDENT:
		case LITERAL_table:
		case LITERAL_endtable:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		do {
			switch ( LA(1)) {
			case LITERAL_environment:
			{
				languageEnv();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case IDENT:
			{
				languageSpecList();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			case LITERAL_table:
			{
				tableDecl();
				astFactory.addASTChild(currentAST, returnAST);
				break;
			}
			default:
			{
				goto _loop156;
			}
			}
		} while (true);
		_loop156:;
		}
		tableLanguage_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_11);
	}
	returnAST = tableLanguage_AST;
}